

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void initialize_impute_calc<ImputedData<unsigned_long,long_double>,InputData<double,unsigned_long>>
               (ImputedData<unsigned_long,_long_double> *imp,
               InputData<double,_unsigned_long> *input_data,size_t row)

{
  size_type sVar1;
  uint uVar2;
  reference pvVar3;
  unsigned_long *puVar4;
  vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
  *this;
  reference this_00;
  unsigned_long in_RDX;
  long *in_RSI;
  long in_RDI;
  size_t cat;
  size_t col_2;
  size_t col_1;
  unsigned_long *res;
  size_t col;
  size_type in_stack_fffffffffffffef8;
  vector<long_double,_std::allocator<long_double>_> *in_stack_ffffffffffffff00;
  unsigned_long *in_stack_ffffffffffffff10;
  ulong uVar5;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined6 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff26;
  ulong local_a0;
  ulong local_80;
  ulong local_58;
  ulong local_20;
  
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  if (*in_RSI == 0) {
    if (in_RSI[0xd] != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      for (local_58 = 0; local_58 < (ulong)in_RSI[1]; local_58 = local_58 + 1) {
        puVar4 = std::lower_bound<unsigned_long*,unsigned_long>
                           ((unsigned_long *)
                            CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
                            (unsigned_long *)
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                            in_stack_ffffffffffffff10);
        if (((puVar4 != (unsigned_long *)
                        (in_RSI[0xc] + *(long *)(in_RSI[0xd] + 8 + local_58 * 8) * 8)) &&
            (*puVar4 == in_RDX)) &&
           ((uVar2 = std::isnan(*(double *)(in_RSI[0xb] + ((long)puVar4 - in_RSI[0xc] >> 3) * 8)),
            (uVar2 & 1) != 0 ||
            (uVar2 = std::isinf(*(double *)(in_RSI[0xb] + ((long)puVar4 - in_RSI[0xc] >> 3) * 8)),
            (uVar2 & 1) != 0)))) {
          sVar1 = *(size_type *)(in_RDI + 0xe8);
          *(size_type *)(in_RDI + 0xe8) = sVar1 + 1;
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0xc0),sVar1);
          *pvVar3 = local_58;
        }
      }
      in_stack_ffffffffffffff1c = SUB104((longdouble)0,0);
      in_stack_ffffffffffffff20 = (undefined6)((unkuint10)(longdouble)0 >> 0x20);
      std::vector<long_double,_std::allocator<long_double>_>::assign
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 (value_type_conflict3 *)0x3f51bb);
      std::vector<long_double,_std::allocator<long_double>_>::assign
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 (value_type_conflict3 *)0x3f51e9);
    }
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    for (local_20 = 0; local_20 < (ulong)in_RSI[1]; local_20 = local_20 + 1) {
      uVar2 = std::isnan(*(double *)(*in_RSI + (in_RDX + local_20 * in_RSI[6]) * 8));
      if (((uVar2 & 1) != 0) ||
         (uVar2 = std::isinf(*(double *)(*in_RSI + (in_RDX + local_20 * in_RSI[6]) * 8)),
         (uVar2 & 1) != 0)) {
        sVar1 = *(size_type *)(in_RDI + 0xd8);
        *(size_type *)(in_RDI + 0xd8) = sVar1 + 1;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x90)
                            ,sVar1);
        *pvVar3 = local_20;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::vector<long_double,_std::allocator<long_double>_>::assign
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(value_type_conflict3 *)0x3f4f6e)
    ;
    std::vector<long_double,_std::allocator<long_double>_>::assign
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(value_type_conflict3 *)0x3f4f9c)
    ;
  }
  if (in_RSI[2] != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    for (local_80 = 0; local_80 < (ulong)in_RSI[5]; local_80 = local_80 + 1) {
      if (*(int *)(in_RSI[2] + (in_RDX + local_80 * in_RSI[6]) * 4) < 0) {
        sVar1 = *(size_type *)(in_RDI + 0xe0);
        *(size_type *)(in_RDI + 0xe0) = sVar1 + 1;
        uVar5 = local_80;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xa8)
                            ,sVar1);
        *pvVar3 = uVar5;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::vector<long_double,_std::allocator<long_double>_>::assign
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(value_type_conflict3 *)0x3f531b)
    ;
    std::
    vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
    ::resize((vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
              *)CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    for (local_a0 = 0; local_a0 < *(ulong *)(in_RDI + 0xe0); local_a0 = local_a0 + 1) {
      this = (vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
              *)(in_RDI + 0x30);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xa8),
                          local_a0);
      this_00 = std::
                vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ::operator[](this,*pvVar3);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xa8),local_a0);
      std::vector<long_double,_std::allocator<long_double>_>::assign
                (this_00,(size_type)this,(value_type_conflict3 *)0x3f53de);
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, InputData &input_data, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (input_data.numeric_data != NULL)
    {
        imp.missing_num.resize(input_data.ncols_numeric);
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            if (is_na_or_inf(input_data.numeric_data[row + col * input_data.nrows]))
                imp.missing_num[imp.n_missing_num++] = col;
        imp.missing_num.resize(imp.n_missing_num);
        imp.num_sum.assign(imp.n_missing_num,    0);
        imp.num_weight.assign(imp.n_missing_num, 0);
    }

    else if (input_data.Xc_indptr != NULL)
    {
        imp.missing_sp.resize(input_data.ncols_numeric);
        decltype(input_data.Xc_indptr) res;
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            res = std::lower_bound(input_data.Xc_ind + input_data.Xc_indptr[col],
                                   input_data.Xc_ind + input_data.Xc_indptr[col + 1],
                                   row);
            if (
                res != input_data.Xc_ind + input_data.Xc_indptr[col + 1] && 
                *res == static_cast<typename std::remove_pointer<decltype(res)>::type>(row) && 
                is_na_or_inf(input_data.Xc[res - input_data.Xc_ind])
                )
            {
                imp.missing_sp[imp.n_missing_sp++] = col;
            }
        }
        imp.sp_num_sum.assign(imp.n_missing_sp,    0);
        imp.sp_num_weight.assign(imp.n_missing_sp, 0);
    }
    
    if (input_data.categ_data != NULL)
    {
        imp.missing_cat.resize(input_data.ncols_categ);
        for (size_t col = 0; col < input_data.ncols_categ; col++)
            if (input_data.categ_data[row + col * input_data.nrows] < 0)
                imp.missing_cat[imp.n_missing_cat++] = col;
        imp.missing_cat.resize(imp.n_missing_cat);
        imp.cat_weight.assign(imp.n_missing_cat, 0);
        imp.cat_sum.resize(input_data.ncols_categ);
        for (size_t cat = 0; cat < imp.n_missing_cat; cat++)
            imp.cat_sum[imp.missing_cat[cat]].assign(input_data.ncat[imp.missing_cat[cat]], 0);
    }
}